

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

btScalar __thiscall
btConvexHullComputer::compute
          (btConvexHullComputer *this,void *coords,bool doubleCoords,int stride,int count,
          btScalar shrink,btScalar shrinkClamp)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Edge **ppEVar3;
  int iVar4;
  Vertex **ppVVar5;
  Edge *pEVar6;
  Edge *pEVar7;
  byte in_DL;
  btConvexHullInternal *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  Edge *f;
  Edge *e_1;
  Edge *firstEdge_1;
  Vertex *v_1;
  int i;
  Edge *r;
  Edge *c;
  int in_stack_000000dc;
  int in_stack_000000e0;
  bool in_stack_000000e7;
  void *in_stack_000000e8;
  btConvexHullInternal *in_stack_000000f0;
  int s;
  Edge *e;
  int prevCopy;
  int firstCopy;
  Edge *firstEdge;
  Vertex *v;
  int copied;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> oldVertices;
  btScalar shift;
  btConvexHullInternal hull;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  Edge *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  Edge *local_1d8;
  Edge *local_1d0;
  int local_1b4;
  Edge *local_180;
  int local_178;
  int local_174;
  int local_14c;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> local_148;
  undefined4 local_124;
  undefined8 local_120;
  undefined4 local_118;
  btVector3 local_114;
  undefined4 local_104;
  btScalar local_100;
  float local_28;
  byte local_19;
  btScalar local_4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_19 = in_DL & 1;
  if (in_R8D < 1) {
    btAlignedObjectArray<btVector3>::clear
              ((btAlignedObjectArray<btVector3> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    btAlignedObjectArray<btConvexHullComputer::Edge>::clear
              ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    btAlignedObjectArray<int>::clear
              ((btAlignedObjectArray<int> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    local_4 = 0.0;
  }
  else {
    local_28 = in_XMM0_Da;
    btConvexHullInternal::btConvexHullInternal
              ((btConvexHullInternal *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
              );
    btConvexHullInternal::compute
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e7,in_stack_000000e0,
               in_stack_000000dc);
    local_100 = 0.0;
    if ((local_28 <= 0.0) ||
       (local_100 = btConvexHullInternal::shrink
                              ((btConvexHullInternal *)oldVertices._8_8_,
                               (btScalar)oldVertices.m_size,(btScalar)oldVertices._0_4_),
       0.0 <= local_100)) {
      btVector3::btVector3(&local_114);
      btAlignedObjectArray<btVector3>::resize
                ((btAlignedObjectArray<btVector3> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),iVar4,
                 (btVector3 *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      local_118 = 0;
      local_120 = 0;
      btAlignedObjectArray<btConvexHullComputer::Edge>::resize
                ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),iVar4,
                 (Edge *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      local_124 = 0;
      btAlignedObjectArray<int>::resize
                ((btAlignedObjectArray<int> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),iVar4,
                 (int *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::btAlignedObjectArray
                ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      getVertexCopy((Vertex *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                    in_stack_fffffffffffffd88);
      for (local_14c = 0;
          iVar4 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::size(&local_148),
          local_14c < iVar4; local_14c = local_14c + 1) {
        ppVVar5 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                            (&local_148,local_14c);
        pVVar1 = *ppVVar5;
        btConvexHullInternal::getCoordinates
                  (in_RDI,(Vertex *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        btAlignedObjectArray<btVector3>::push_back
                  ((btAlignedObjectArray<btVector3> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (btVector3 *)in_stack_fffffffffffffd98);
        pEVar2 = pVVar1->edges;
        if (pEVar2 != (Edge *)0x0) {
          local_174 = -1;
          local_178 = -1;
          local_180 = pEVar2;
          do {
            if (local_180->copy < 0) {
              iVar4 = btAlignedObjectArray<btConvexHullComputer::Edge>::size
                                ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                                 &in_RDI->vertexPool);
              in_stack_fffffffffffffdcc = iVar4;
              btAlignedObjectArray<btConvexHullComputer::Edge>::push_back
                        ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         in_stack_fffffffffffffd98);
              btAlignedObjectArray<btConvexHullComputer::Edge>::push_back
                        ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         in_stack_fffffffffffffd98);
              pEVar6 = btAlignedObjectArray<btConvexHullComputer::Edge>::operator[]
                                 ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                                  &in_RDI->vertexPool,iVar4);
              pEVar7 = btAlignedObjectArray<btConvexHullComputer::Edge>::operator[]
                                 ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                                  &in_RDI->vertexPool,iVar4 + 1);
              local_180->copy = iVar4;
              local_180->reverse->copy = iVar4 + 1;
              pEVar6->reverse = 1;
              pEVar7->reverse = -1;
              iVar4 = getVertexCopy((Vertex *)
                                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                    in_stack_fffffffffffffd88);
              pEVar6->targetVertex = iVar4;
              pEVar7->targetVertex = local_14c;
            }
            if (local_178 < 0) {
              local_174 = local_180->copy;
            }
            else {
              in_stack_fffffffffffffda4 = local_178 - local_180->copy;
              pEVar6 = btAlignedObjectArray<btConvexHullComputer::Edge>::operator[]
                                 ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                                  &in_RDI->vertexPool,local_180->copy);
              pEVar6->next = in_stack_fffffffffffffda4;
            }
            local_178 = local_180->copy;
            local_180 = local_180->next;
          } while (local_180 != pEVar2);
          in_stack_fffffffffffffd94 = local_178 - local_174;
          in_stack_fffffffffffffd98 =
               btAlignedObjectArray<btConvexHullComputer::Edge>::operator[]
                         ((btAlignedObjectArray<btConvexHullComputer::Edge> *)&in_RDI->vertexPool,
                          local_174);
          in_stack_fffffffffffffd98->next = in_stack_fffffffffffffd94;
        }
      }
      for (local_1b4 = 0; local_1b4 < local_14c; local_1b4 = local_1b4 + 1) {
        ppVVar5 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                            (&local_148,local_1b4);
        pEVar2 = (*ppVVar5)->edges;
        local_1d0 = pEVar2;
        if (pEVar2 != (Edge *)0x0) {
          do {
            if (-1 < local_1d0->copy) {
              btAlignedObjectArray<int>::push_back
                        ((btAlignedObjectArray<int> *)
                         CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         &in_stack_fffffffffffffd98->next);
              local_1d8 = local_1d0;
              do {
                local_1d8->copy = -1;
                local_1d8 = local_1d8->reverse->prev;
              } while (local_1d8 != local_1d0);
            }
            ppEVar3 = &local_1d0->next;
            local_1d0 = *ppEVar3;
          } while (*ppEVar3 != pEVar2);
        }
      }
      local_4 = local_100;
      local_104 = 1;
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::~btAlignedObjectArray
                ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)0x150ad0);
    }
    else {
      btAlignedObjectArray<btVector3>::clear
                ((btAlignedObjectArray<btVector3> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      btAlignedObjectArray<btConvexHullComputer::Edge>::clear
                ((btAlignedObjectArray<btConvexHullComputer::Edge> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      btAlignedObjectArray<int>::clear
                ((btAlignedObjectArray<int> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      local_4 = local_100;
      local_104 = 1;
    }
    btConvexHullInternal::~btConvexHullInternal
              ((btConvexHullInternal *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
              );
  }
  return local_4;
}

Assistant:

btScalar btConvexHullComputer::compute(const void* coords, bool doubleCoords, int stride, int count, btScalar shrink, btScalar shrinkClamp)
{
	if (count <= 0)
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return 0;
	}

	btConvexHullInternal hull;
	hull.compute(coords, doubleCoords, stride, count);

	btScalar shift = 0;
	if ((shrink > 0) && ((shift = hull.shrink(shrink, shrinkClamp)) < 0))
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return shift;
	}

	vertices.resize(0);
	edges.resize(0);
	faces.resize(0);

	btAlignedObjectArray<btConvexHullInternal::Vertex*> oldVertices;
	getVertexCopy(hull.vertexList, oldVertices);
	int copied = 0;
	while (copied < oldVertices.size())
	{
		btConvexHullInternal::Vertex* v = oldVertices[copied];
		vertices.push_back(hull.getCoordinates(v));
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			int firstCopy = -1;
			int prevCopy = -1;
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy < 0)
				{
					int s = edges.size();
					edges.push_back(Edge());
					edges.push_back(Edge());
					Edge* c = &edges[s];
					Edge* r = &edges[s + 1];
					e->copy = s;
					e->reverse->copy = s + 1;
					c->reverse = 1;
					r->reverse = -1;
					c->targetVertex = getVertexCopy(e->target, oldVertices);
					r->targetVertex = copied;
#ifdef DEBUG_CONVEX_HULL
					printf("      CREATE: Vertex *%d has edge to *%d\n", copied, c->getTargetVertex());
#endif
				}
				if (prevCopy >= 0)
				{
					edges[e->copy].next = prevCopy - e->copy;
				}
				else
				{
					firstCopy = e->copy;
				}
				prevCopy = e->copy;
				e = e->next;
			} while (e != firstEdge);
			edges[firstCopy].next = prevCopy - firstCopy;
		}
		copied++;
	}

	for (int i = 0; i < copied; i++)
	{
		btConvexHullInternal::Vertex* v = oldVertices[i];
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy >= 0)
				{
#ifdef DEBUG_CONVEX_HULL
					printf("Vertex *%d has edge to *%d\n", i, edges[e->copy].getTargetVertex());
#endif
					faces.push_back(e->copy);
					btConvexHullInternal::Edge* f = e;
					do
					{
#ifdef DEBUG_CONVEX_HULL
						printf("   Face *%d\n", edges[f->copy].getTargetVertex());
#endif
						f->copy = -1;
						f = f->reverse->prev;
					} while (f != e);
				}
				e = e->next;
			} while (e != firstEdge);
		}
	}

	return shift;
}